

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmBcc<(moira::Instr)23,(moira::Mode)12,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  Syntax SVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  StrWriter *pSVar6;
  char cVar7;
  
  uVar1 = *addr;
  SVar2 = str->style->syntax;
  if (SVar2 - GNU < 2) {
    cVar7 = 'b';
    lVar5 = 1;
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar7;
      cVar7 = "dbpl"[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    pSVar6 = StrWriter::operator<<(str);
    if ((pSVar6->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar4 = pSVar6->ptr;
      pSVar6->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
      str = pSVar6;
    }
    else {
      iVar3 = (str->tab).raw;
      do {
        pcVar4 = pSVar6->ptr;
        pSVar6->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
        str = pSVar6;
      } while (pSVar6->ptr < pSVar6->base + iVar3);
    }
  }
  else {
    if (SVar2 == MUSASHI) {
      if ((char)op == -1) {
        dasmIllegal<(moira::Instr)23,(moira::Mode)12,1>(this,str,addr,op);
        return;
      }
      cVar7 = 'b';
      lVar5 = 1;
      do {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = cVar7;
        cVar7 = "dbpl"[lVar5 + 1];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
        iVar3 = (str->tab).raw;
        do {
          pcVar4 = str->ptr;
          str->ptr = pcVar4 + 1;
          *pcVar4 = ' ';
        } while (str->ptr < str->base + iVar3);
        goto LAB_001ea32d;
      }
    }
    else {
      cVar7 = 'b';
      lVar5 = 1;
      do {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = cVar7;
        cVar7 = "dbpl"[lVar5 + 1];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
        iVar3 = (str->tab).raw;
        do {
          pcVar4 = str->ptr;
          str->ptr = pcVar4 + 1;
          *pcVar4 = ' ';
        } while (str->ptr < str->base + iVar3);
        goto LAB_001ea32d;
      }
    }
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
LAB_001ea32d:
  StrWriter::operator<<(str,(UInt)((char)op + 2 + uVar1));
  return;
}

Assistant:

void
Moira::dasmBcc(StrWriter &str, u32 &addr, u16 op) const
{
    u32 dst = addr;
    U32_INC(dst, 2);
    U32_INC(dst, S == Byte ? (i8)op : SEXT<S>(dasmIncRead<S>(addr)));

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            if (S == Byte && (u8)op == 0xFF) {

                dasmIllegal<I, M, S>(str, addr, op);
                break;
            }

            str << Ins<I>{} << str.tab << UInt(dst) << Av<I, M, S>{};
            break;

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << Szb<S>{} << str.tab << UInt(dst);
            break;

        default:

            str << Ins<I>{} << str.tab << UInt(dst) << Av<I, M, S>{};
            break;
    }
}